

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandExact(Abc_Frame_t *pAbc,int argc,char **argv)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  int nMaxDepth;
  uint fVerbose;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  long lVar10;
  ulong *__s;
  Gia_Man_t *pNew;
  Abc_Ntk_t *pNtk;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  ulong uVar14;
  char *pcVar15;
  uint uVar16;
  uint uVar17;
  byte *pbVar18;
  byte bVar19;
  uint uVar20;
  int *pArrTimeProfile_00;
  ulong uVar21;
  uint nFunc;
  uint local_2ac;
  uint local_2a0;
  undefined8 local_278;
  int pArrTimeProfile [8];
  word pTruth [64];
  
  bVar5 = false;
  Extra_UtilGetoptReset();
  nMaxDepth = -1;
  local_2a0 = 400000;
  local_278 = 1;
  fVerbose = 0;
  local_2ac = 0;
  bVar3 = false;
  bVar4 = false;
  do {
    while (iVar7 = Extra_UtilGetopt(argc,argv,"DASCatvh"), iVar8 = globalUtilOptind, iVar7 != 0x44)
    {
      if (iVar7 < 0x53) {
        if (iVar7 == -1) {
          if (bVar5) {
            puts("run test suite, ignore all other settings");
            Abc_ExactTest(fVerbose);
            Abc_ExactStoreTest(fVerbose);
            return 0;
          }
          lVar10 = (long)globalUtilOptind;
          if (argc != globalUtilOptind) {
            nFunc = 0;
            memset(pTruth,0,0x200);
            if (argc <= iVar8) goto LAB_0024d8af;
            nFunc = argc - iVar8;
            uVar21 = 0;
            goto LAB_0024d5ba;
          }
          goto LAB_0024d437;
        }
        if (iVar7 == 0x41) {
          lVar10 = (long)globalUtilOptind;
          if (argc <= globalUtilOptind) {
            pcVar13 = "Command line switch \"-A\" should be followed by an integer.\n";
            goto LAB_0024d42b;
          }
          globalUtilOptind = globalUtilOptind + 1;
          pcVar13 = argv[lVar10];
          pcVar15 = argv[lVar10];
          while( true ) {
            pcVar2 = pcVar13;
            pcVar13 = pcVar2 + 1;
            if (*pcVar2 == '\0') break;
            if (*pcVar2 == ',') {
              *pcVar2 = '\0';
              iVar8 = atoi(pcVar15);
              lVar10 = (long)(int)local_2ac;
              local_2ac = local_2ac + 1;
              pArrTimeProfile[lVar10] = iVar8;
              *pcVar2 = ',';
              pcVar15 = pcVar13;
            }
          }
          iVar8 = atoi(pcVar15);
          lVar10 = (long)(int)local_2ac;
          local_2ac = local_2ac + 1;
          pArrTimeProfile[lVar10] = iVar8;
          bVar4 = true;
        }
        else {
          if (iVar7 != 0x43) goto LAB_0024d437;
          if (argc <= globalUtilOptind) {
            pcVar13 = "Command line switch \"-C\" should be followed by an integer.\n";
            goto LAB_0024d42b;
          }
          local_2a0 = atoi(argv[globalUtilOptind]);
          globalUtilOptind = iVar8 + 1;
        }
      }
      else if (iVar7 < 0x74) {
        if (iVar7 == 0x53) {
          if (argc <= globalUtilOptind) {
            pcVar13 = "Command line switch \"-S\" should be followed by an integer.\n";
            goto LAB_0024d42b;
          }
          iVar7 = atoi(argv[globalUtilOptind]);
          local_278 = CONCAT44(extraout_var,iVar7);
          globalUtilOptind = iVar8 + 1;
          if (iVar7 < 1) goto LAB_0024d437;
        }
        else {
          if (iVar7 != 0x61) goto LAB_0024d437;
          bVar3 = (bool)(bVar3 ^ 1);
        }
      }
      else if (iVar7 == 0x74) {
        bVar5 = (bool)(bVar5 ^ 1);
      }
      else {
        if (iVar7 != 0x76) goto LAB_0024d437;
        fVerbose = fVerbose ^ 1;
      }
    }
    if (argc <= globalUtilOptind) {
      pcVar13 = "Command line switch \"-D\" should be followed by an integer.\n";
      goto LAB_0024d42b;
    }
    nMaxDepth = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar8 + 1;
  } while (-1 < nMaxDepth);
LAB_0024d437:
  Abc_Print(-2,"usage: exact [-DSC <num>] [-A <list>] [-atvh] <truth1> <truth2> ...\n");
  Abc_Print(-2,
            "\t           finds optimum networks using SAT-based exact synthesis for hex truth tables <truth1> <truth2> ...\n"
           );
  Abc_Print(-2,"\t-D <num>  : constrain maximum depth (if too low, algorithm may not terminate)\n");
  Abc_Print(-2,"\t-A <list> : input arrival times (comma separated list)\n");
  Abc_Print(-2,"\t-S <num>  : number of start gates in search [default = %d]\n",local_278);
  Abc_Print(-2,
            "\t-C <num>  : the limit on the number of conflicts; turn off with 0 [default = %d]\n",
            (ulong)local_2a0);
  pcVar15 = "yes";
  pcVar13 = "yes";
  if (!bVar3) {
    pcVar13 = "no";
  }
  Abc_Print(-2,"\t-a        : toggle create AIG [default = %s]\n",pcVar13);
  Abc_Print(-2,"\t-t        : run test suite\n");
  if (fVerbose == 0) {
    pcVar15 = "no";
  }
  Abc_Print(-2,"\t-v        : toggle verbose printout [default = %s]\n",pcVar15);
  Abc_Print(-2,"\t-h        : print the command usage\n");
  Abc_Print(-2,"\t\n");
  Abc_Print(-2,
            "\t            This command was contributed by Mathias Soeken from EPFL in July 2016.\n"
           );
  Abc_Print(-2,"\t            The author can be contacted as mathias.soeken at epfl.ch\n");
  return 1;
LAB_0024d5ba:
  if (uVar21 == 0x10) {
    pcVar13 = "Too many functions (at most 16 supported).\n";
    goto LAB_0024d42b;
  }
  globalUtilOptind = (int)(lVar10 + 1);
  pbVar18 = (byte *)argv[lVar10];
  bVar19 = *pbVar18;
  if (bVar19 == 0x30) {
    pbVar18 = pbVar18 + (ulong)(pbVar18[1] == 0x78) * 2;
    bVar19 = *pbVar18;
  }
  __s = pTruth + uVar21 * 4;
  uVar9 = 2;
  if (((byte)(bVar19 - 0x3a) < 0xf6) && ((byte)((bVar19 & 0xdf) + 0xb9) < 0xfa)) {
    uVar11 = 0;
LAB_0024d6a1:
    uVar11 = uVar11 * 0x100000001;
LAB_0024d6a7:
    *__s = uVar11;
  }
  else {
    uVar11 = 0;
    uVar17 = 1;
    do {
      do {
        uVar16 = uVar17;
        lVar6 = uVar11 + 1;
        uVar11 = uVar11 + 1;
        uVar17 = uVar16 + 1;
      } while (0xf5 < (byte)(pbVar18[lVar6] - 0x3a));
    } while (0xf9 < (byte)((pbVar18[lVar6] & 0xdf) + 0xb9));
    iVar8 = (int)uVar11;
    if (iVar8 == 0) {
      uVar11 = uVar11 & 0xffffffff;
      goto LAB_0024d6a1;
    }
    if (iVar8 == 1) {
      uVar20 = 2;
      uVar17 = 1;
      if (bVar19 < 0x41) {
        if (bVar19 == 0x30) goto LAB_0024d714;
        if (bVar19 != 0x35) goto LAB_0024d726;
LAB_0024d7f7:
        uVar11 = 0xaaaaaaaaaaaaaaaa;
        if (bVar19 == 0x35) {
          uVar11 = 0x5555555555555555;
        }
        uVar9 = 1;
      }
      else {
        if (bVar19 == 0x41) goto LAB_0024d7f7;
        if (bVar19 != 0x46) goto LAB_0024d726;
LAB_0024d714:
        uVar11 = -(ulong)(bVar19 != 0x30);
        uVar9 = 0;
      }
      goto LAB_0024d6a7;
    }
    uVar12 = 0x1f;
    if (iVar8 - 1U != 0) {
      for (; iVar8 - 1U >> uVar12 == 0; uVar12 = uVar12 - 1) {
      }
    }
    uVar12 = uVar12 ^ 0x1f;
    uVar20 = 0x22 - uVar12;
    uVar17 = 1;
    if (uVar20 < 7) {
LAB_0024d726:
      memset(__s,0,(ulong)uVar17 << 3);
      uVar9 = uVar20;
    }
    else {
      uVar17 = 1 << (0x1cU - (char)uVar12 & 0x1f);
      uVar9 = 0x25;
      if (uVar12 != 0xfffffffd) goto LAB_0024d726;
    }
    pbVar18 = pbVar18 + (int)uVar16;
    bVar19 = 0;
    uVar11 = 0;
    do {
      pbVar18 = pbVar18 + -1;
      bVar1 = *pbVar18;
      if ((byte)(bVar1 - 0x30) < 10) {
        iVar8 = -0x30;
      }
      else if ((byte)(bVar1 + 0xbf) < 6) {
        iVar8 = -0x37;
      }
      else {
        iVar8 = -0x57;
        if (5 < (byte)(bVar1 + 0x9f)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                        ,0x3c8,"int Abc_TtReadHexDigit(char)");
        }
      }
      __s[uVar11 >> 4 & 0xfffffff] =
           __s[uVar11 >> 4 & 0xfffffff] | (ulong)(iVar8 + (uint)bVar1) << (bVar19 & 0x3c);
      uVar11 = uVar11 + 1;
      bVar19 = bVar19 + 4;
    } while (uVar16 != uVar11);
    if ((int)uVar9 < 6) {
      if ((int)uVar9 < 0) {
        __assert_fail("nVars >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                      ,0x392,"word Abc_Tt6Stretch(word, int)");
      }
      uVar14 = *__s;
      uVar17 = (uint)uVar14;
      if (uVar9 < 2) {
        uVar11 = (ulong)(uVar17 & 3) * 0x5555;
LAB_0024d850:
        if (4 < uVar9) goto LAB_0024d6a1;
        uVar14 = (ulong)(uint)((int)uVar11 << 0x10);
      }
      else {
        uVar11 = uVar14 & 0xffffffff;
        if (uVar9 == 2) {
          uVar11 = (ulong)(uVar17 & 0xf) * 0x1111;
          goto LAB_0024d850;
        }
        if (uVar9 < 4) {
          uVar11 = (ulong)(uint)((int)(uVar14 & 0xff) << 8) | uVar14 & 0xff;
          goto LAB_0024d850;
        }
        if (4 < uVar9) goto LAB_0024d6a1;
        uVar14 = uVar14 & 0xffff;
        uVar11 = (ulong)(uVar17 << 0x10);
      }
      uVar11 = uVar11 | uVar14;
      goto LAB_0024d6a1;
    }
  }
  uVar17 = uVar9;
  if (local_2ac != 0) {
    if (8 < (int)local_2ac) {
      pcVar13 = "Only 8-variable functions are supported.\n";
LAB_0024d42b:
      Abc_Print(-1,pcVar13);
      goto LAB_0024d437;
    }
    uVar17 = local_2ac;
    if (local_2ac != uVar9) {
      pcVar13 = "All functions need to have the same size.\n";
      goto LAB_0024d42b;
    }
  }
  local_2ac = uVar17;
  uVar21 = uVar21 + 1;
  lVar10 = lVar10 + 1;
  if (uVar21 == nFunc) goto LAB_0024d8af;
  goto LAB_0024d5ba;
LAB_0024d8af:
  pArrTimeProfile_00 = pArrTimeProfile;
  if (!bVar4) {
    pArrTimeProfile_00 = (int *)0x0;
  }
  iVar8 = (int)local_278 + -1;
  if (bVar3) {
    pNew = Gia_ManFindExact(pTruth,local_2ac,nFunc,nMaxDepth,pArrTimeProfile_00,local_2a0,iVar8,
                            fVerbose);
    if (pNew == (Gia_Man_t *)0x0) {
      pcVar13 = 
      "Could not find AIG within given resource constraints, retry with different value for -C.\n";
LAB_0024d976:
      Abc_Print(0,pcVar13);
      return 0;
    }
    Abc_FrameUpdateGia(pAbc,pNew);
  }
  else {
    pNtk = Abc_NtkFindExact(pTruth,local_2ac,nFunc,nMaxDepth,pArrTimeProfile_00,local_2a0,iVar8,
                            fVerbose);
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar13 = 
      "Could not find network within given resource constraints, retry with different value for -C.\n"
      ;
      goto LAB_0024d976;
    }
    Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
    Abc_FrameClearVerifStatus(pAbc);
  }
  return 0;
}

Assistant:

int Abc_CommandExact( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManFindExact( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrivalTimes, int nBTLimit, int nStartGates, int fVerbose );

    int c, nMaxDepth = -1, fMakeAIG = 0, fTest = 0, fVerbose = 0, nVars = 0, nVarsTmp, nFunc = 0, nStartGates = 1, nBTLimit = 400000;
    char * p1, * p2;
    word pTruth[64];
    int pArrTimeProfile[8], fHasArrTimeProfile = 0;
    Abc_Ntk_t * pNtkRes;
    Gia_Man_t * pGiaRes;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "DASCatvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nMaxDepth = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nMaxDepth < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            fHasArrTimeProfile = 1;
            p1 = p2 = argv[globalUtilOptind++];
            while ( true ) {
                if ( *p2 == ',' )
                {
                    *p2 = '\0';
                    pArrTimeProfile[nVars++] = atoi( p1 );
                    *p2++ = ',';
                    p1 = p2;
                }
                else if ( *p2 == '\0' )
                {
                    pArrTimeProfile[nVars++] = atoi( p1 );
                    break;
                }
                else
                    ++p2;
            }
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nStartGates = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nStartGates < 1 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'a':
            fMakeAIG ^= 1;
            break;
        case 't':
            fTest ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( fTest )
    {
        extern void Abc_ExactTest( int fVerbose );
        extern void Abc_ExactStoreTest( int fVerbose );

        printf( "run test suite, ignore all other settings\n" );
        Abc_ExactTest( fVerbose );
        Abc_ExactStoreTest( fVerbose );
        return 0;
    }

    if ( argc == globalUtilOptind )
        goto usage;

    memset( pTruth, 0, 64 * sizeof(word) );
    while ( globalUtilOptind < argc )
    {
        if ( nFunc == 16 )
        {
            Abc_Print( -1, "Too many functions (at most 16 supported).\n" );
            goto usage;
        }
        nVarsTmp = Abc_TtReadHex( &pTruth[nFunc << 2], argv[globalUtilOptind++] );
        nFunc++;
        if ( nVars == 0 )
            nVars = nVarsTmp;
        else if ( nVars > 8 )
        {
            Abc_Print( -1, "Only 8-variable functions are supported.\n" );
            goto usage;
        }
        else if ( nVars != nVarsTmp )
        {
            Abc_Print( -1, "All functions need to have the same size.\n" );
            goto usage;
        }
    }

    if ( fMakeAIG )
    {
        pGiaRes = Gia_ManFindExact( pTruth, nVars, nFunc, nMaxDepth, fHasArrTimeProfile ? pArrTimeProfile : NULL, nBTLimit, nStartGates - 1, fVerbose );
        if ( pGiaRes )
            Abc_FrameUpdateGia( pAbc, pGiaRes );
        else
            Abc_Print( 0, "Could not find AIG within given resource constraints, retry with different value for -C.\n" );
    }
    else
    {
        pNtkRes = Abc_NtkFindExact( pTruth, nVars, nFunc, nMaxDepth, fHasArrTimeProfile ? pArrTimeProfile : NULL, nBTLimit, nStartGates - 1, fVerbose );
        if ( pNtkRes )
        {
            Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
            Abc_FrameClearVerifStatus( pAbc );
        }
        else
            Abc_Print( 0, "Could not find network within given resource constraints, retry with different value for -C.\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: exact [-DSC <num>] [-A <list>] [-atvh] <truth1> <truth2> ...\n" );
    Abc_Print( -2, "\t           finds optimum networks using SAT-based exact synthesis for hex truth tables <truth1> <truth2> ...\n" );
    Abc_Print( -2, "\t-D <num>  : constrain maximum depth (if too low, algorithm may not terminate)\n" );
    Abc_Print( -2, "\t-A <list> : input arrival times (comma separated list)\n" );
    Abc_Print( -2, "\t-S <num>  : number of start gates in search [default = %d]\n", nStartGates );
    Abc_Print( -2, "\t-C <num>  : the limit on the number of conflicts; turn off with 0 [default = %d]\n", nBTLimit );
    Abc_Print( -2, "\t-a        : toggle create AIG [default = %s]\n", fMakeAIG ? "yes" : "no" );
    Abc_Print( -2, "\t-t        : run test suite\n" );
    Abc_Print( -2, "\t-v        : toggle verbose printout [default = %s]\n", fVerbose ? "yes" : "no" );
    Abc_Print( -2, "\t-h        : print the command usage\n" );
    Abc_Print( -2, "\t\n" );
    Abc_Print( -2, "\t            This command was contributed by Mathias Soeken from EPFL in July 2016.\n" );
    Abc_Print( -2, "\t            The author can be contacted as mathias.soeken at epfl.ch\n" );
    return 1;
}